

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

void __thiscall
vkt::clipping::anon_unknown_0::ClipDistance::initPrograms
          (ClipDistance *this,SourceCollections *programCollection,CaseDefinition caseDef)

{
  undefined8 uVar1;
  ostream *poVar2;
  char *pcVar3;
  ProgramSources *pPVar4;
  string local_b98;
  ShaderSource local_b78;
  allocator<char> local_b49;
  string local_b48;
  ostringstream local_b28 [8];
  ostringstream src_4;
  string local_9b0;
  ShaderSource local_990;
  allocator<char> local_961;
  string local_960;
  int local_93c;
  int local_938;
  int i_7;
  int i_6;
  int vertNdx;
  ostringstream src_3;
  string local_7b8;
  ShaderSource local_798;
  allocator<char> local_769;
  string local_768;
  int local_748;
  int local_744;
  int i_5;
  int i_4;
  ostringstream src_2;
  string local_5c8;
  ShaderSource local_5a8;
  allocator<char> local_579;
  string local_578;
  int local_558;
  int local_554;
  int i_3;
  int i_2;
  ostringstream src_1;
  string local_3d8;
  ShaderSource local_3b8;
  allocator<char> local_389;
  string local_388;
  int local_368;
  int local_364;
  int i_1;
  int i;
  ostringstream src;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream str;
  string local_40 [8];
  string perVertexBlock;
  SourceCollections *programCollection_local;
  CaseDefinition caseDef_local;
  
  perVertexBlock.field_2._8_8_ = this;
  std::__cxx11::string::string(local_40);
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar2 = std::operator<<((ostream *)local_1b8,"gl_PerVertex {\n");
  std::operator<<(poVar2,"    vec4  gl_Position;\n");
  caseDef_local.topology = caseDef.topology;
  if (0 < (int)caseDef_local.topology) {
    poVar2 = std::operator<<((ostream *)local_1b8,"    float gl_ClipDistance[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local.topology);
    std::operator<<(poVar2,"];\n");
  }
  caseDef_local._4_4_ = caseDef._4_4_;
  if (0 < (int)caseDef_local._4_4_) {
    poVar2 = std::operator<<((ostream *)local_1b8,"    float gl_CullDistance[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local._4_4_);
    std::operator<<(poVar2,"];\n");
  }
  std::operator<<((ostream *)local_1b8,"}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=(local_40,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i_1);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)&i_1,pcVar3);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 v_position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out ");
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2,";\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position = v_position;\n");
  poVar2 = std::operator<<(poVar2,
                           "    out_color   = vec4(1.0, 0.5 * (v_position.x + 1.0), 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"    const int barNdx = gl_VertexIndex / 6;\n");
  if (((ulong)programCollection & 0x100000000) == 0) {
    for (local_364 = 0; local_364 < (int)caseDef_local.topology; local_364 = local_364 + 1) {
      poVar2 = std::operator<<((ostream *)&i_1,"    gl_ClipDistance[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_364);
      poVar2 = std::operator<<(poVar2,"] = (barNdx == ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_364);
      std::operator<<(poVar2," ? v_position.y : 0.0);\n");
    }
    for (local_368 = 0; local_368 < (int)caseDef_local._4_4_; local_368 = local_368 + 1) {
      poVar2 = std::operator<<((ostream *)&i_1,"    gl_CullDistance[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_368);
      std::operator<<(poVar2,"] = 0.0;\n");
    }
  }
  else {
    if (0 < (int)caseDef_local.topology) {
      poVar2 = std::operator<<((ostream *)&i_1,"    for (int i = 0; i < ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local.topology);
      poVar2 = std::operator<<(poVar2,"; ++i)\n");
      std::operator<<(poVar2,"        gl_ClipDistance[i] = (barNdx == i ? v_position.y : 0.0);\n");
    }
    if (0 < (int)caseDef_local._4_4_) {
      poVar2 = std::operator<<((ostream *)&i_1,"    for (int i = 0; i < ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local._4_4_);
      poVar2 = std::operator<<(poVar2,"; ++i)\n");
      std::operator<<(poVar2,"        gl_CullDistance[i] = 0.0;\n");
    }
  }
  std::operator<<((ostream *)&i_1,"}\n");
  uVar1 = perVertexBlock.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"vert",&local_389);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)uVar1,&local_388);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_3b8,&local_3d8);
  glu::ProgramSources::operator<<(pPVar4,&local_3b8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i_1);
  if (((ulong)programCollection & 0x10000000000) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i_3);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar2 = std::operator<<((ostream *)&i_3,pcVar3);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(vertices = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    poVar2 = std::operator<<(poVar2,") out;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 in_color[];\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color[];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"in ");
    poVar2 = std::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2," gl_in[gl_MaxPatchVertices];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"out ");
    poVar2 = std::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2," gl_out[];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelInner[0] = 1.0;\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelInner[1] = 1.0;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[0] = 1.0;\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[1] = 1.0;\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[2] = 1.0;\n");
    poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[3] = 1.0;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,
                             "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    poVar2 = std::operator<<(poVar2,
                             "    out_color[gl_InvocationID]          = in_color[gl_InvocationID];\n"
                            );
    std::operator<<(poVar2,"\n");
    if (((ulong)programCollection & 0x100000000) == 0) {
      for (local_554 = 0; local_554 < (int)caseDef_local.topology; local_554 = local_554 + 1) {
        poVar2 = std::operator<<((ostream *)&i_3,"    gl_out[gl_InvocationID].gl_ClipDistance[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_554);
        poVar2 = std::operator<<(poVar2,"] = gl_in[gl_InvocationID].gl_ClipDistance[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_554);
        std::operator<<(poVar2,"];\n");
      }
      for (local_558 = 0; local_558 < (int)caseDef_local._4_4_; local_558 = local_558 + 1) {
        poVar2 = std::operator<<((ostream *)&i_3,"    gl_out[gl_InvocationID].gl_CullDistance[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_558);
        poVar2 = std::operator<<(poVar2,"] = gl_in[gl_InvocationID].gl_CullDistance[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_558);
        std::operator<<(poVar2,"];\n");
      }
    }
    else {
      if (0 < (int)caseDef_local.topology) {
        poVar2 = std::operator<<((ostream *)&i_3,"    for (int i = 0; i < ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local.topology);
        poVar2 = std::operator<<(poVar2,"; ++i)\n");
        std::operator<<(poVar2,
                        "        gl_out[gl_InvocationID].gl_ClipDistance[i] = gl_in[gl_InvocationID].gl_ClipDistance[i];\n"
                       );
      }
      if (0 < (int)caseDef_local._4_4_) {
        poVar2 = std::operator<<((ostream *)&i_3,"    for (int i = 0; i < ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local._4_4_);
        poVar2 = std::operator<<(poVar2,"; ++i)\n");
        std::operator<<(poVar2,
                        "        gl_out[gl_InvocationID].gl_CullDistance[i] = gl_in[gl_InvocationID].gl_CullDistance[i];\n"
                       );
      }
    }
    std::operator<<((ostream *)&i_3,"}\n");
    uVar1 = perVertexBlock.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"tesc",&local_579);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)uVar1,&local_578);
    std::__cxx11::ostringstream::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_5a8,&local_5c8);
    glu::ProgramSources::operator<<(pPVar4,&local_5a8);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator(&local_579);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i_3);
  }
  if (((ulong)programCollection & 0x10000000000) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i_5);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar2 = std::operator<<((ostream *)&i_5,pcVar3);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(triangles, equal_spacing, ccw) in;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 in_color[];\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"in ");
    poVar2 = std::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2," gl_in[gl_MaxPatchVertices];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"out ");
    poVar2 = std::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"    vec3 px     = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
                            );
    poVar2 = std::operator<<(poVar2,"    vec3 py     = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
                            );
    poVar2 = std::operator<<(poVar2,"    vec3 pz     = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
                            );
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(px + py + pz, 1.0);\n");
    poVar2 = std::operator<<(poVar2,
                             "    out_color   = (in_color[0] + in_color[1] + in_color[2]) / 3.0;\n")
    ;
    std::operator<<(poVar2,"\n");
    if (((ulong)programCollection & 0x100000000) == 0) {
      for (local_744 = 0; local_744 < (int)caseDef_local.topology; local_744 = local_744 + 1) {
        poVar2 = std::operator<<((ostream *)&i_5,"    gl_ClipDistance[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_744);
        poVar2 = std::operator<<(poVar2,"] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_744);
        poVar2 = std::operator<<(poVar2,"]\n");
        poVar2 = std::operator<<(poVar2,
                                 "                       + gl_TessCoord.y * gl_in[1].gl_ClipDistance["
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_744);
        poVar2 = std::operator<<(poVar2,"]\n");
        poVar2 = std::operator<<(poVar2,
                                 "                       + gl_TessCoord.z * gl_in[2].gl_ClipDistance["
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_744);
        std::operator<<(poVar2,"];\n");
      }
      for (local_748 = 0; local_748 < (int)caseDef_local._4_4_; local_748 = local_748 + 1) {
        poVar2 = std::operator<<((ostream *)&i_5,"    gl_CullDistance[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_748);
        poVar2 = std::operator<<(poVar2,"] = gl_TessCoord.x * gl_in[0].gl_CullDistance[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_748);
        poVar2 = std::operator<<(poVar2,"]\n");
        poVar2 = std::operator<<(poVar2,
                                 "                       + gl_TessCoord.y * gl_in[1].gl_CullDistance["
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_748);
        poVar2 = std::operator<<(poVar2,"]\n");
        poVar2 = std::operator<<(poVar2,
                                 "                       + gl_TessCoord.z * gl_in[2].gl_CullDistance["
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_748);
        std::operator<<(poVar2,"];\n");
      }
    }
    else {
      if (0 < (int)caseDef_local.topology) {
        poVar2 = std::operator<<((ostream *)&i_5,"    for (int i = 0; i < ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local.topology);
        poVar2 = std::operator<<(poVar2,"; ++i)\n");
        poVar2 = std::operator<<(poVar2,
                                 "        gl_ClipDistance[i] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[i]\n"
                                );
        poVar2 = std::operator<<(poVar2,
                                 "                           + gl_TessCoord.y * gl_in[1].gl_ClipDistance[i]\n"
                                );
        std::operator<<(poVar2,
                        "                           + gl_TessCoord.z * gl_in[2].gl_ClipDistance[i];\n"
                       );
      }
      if (0 < (int)caseDef_local._4_4_) {
        poVar2 = std::operator<<((ostream *)&i_5,"    for (int i = 0; i < ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local._4_4_);
        poVar2 = std::operator<<(poVar2,"; ++i)\n");
        poVar2 = std::operator<<(poVar2,
                                 "        gl_CullDistance[i] = gl_TessCoord.x * gl_in[0].gl_CullDistance[i]\n"
                                );
        poVar2 = std::operator<<(poVar2,
                                 "                           + gl_TessCoord.y * gl_in[1].gl_CullDistance[i]\n"
                                );
        std::operator<<(poVar2,
                        "                           + gl_TessCoord.z * gl_in[2].gl_CullDistance[i];\n"
                       );
      }
    }
    std::operator<<((ostream *)&i_5,"}\n");
    uVar1 = perVertexBlock.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"tese",&local_769);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)uVar1,&local_768);
    std::__cxx11::ostringstream::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_798,&local_7b8);
    glu::ProgramSources::operator<<(pPVar4,&local_798);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_798);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator(&local_769);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i_5);
  }
  if (((ulong)programCollection & 0x1000000000000) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i_6);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar2 = std::operator<<((ostream *)&i_6,pcVar3);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(triangles) in;\n");
    poVar2 = std::operator<<(poVar2,"layout(triangle_strip, max_vertices = 3) out;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 in_color[];\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"in ");
    poVar2 = std::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2," gl_in[];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"out ");
    poVar2 = std::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    std::operator<<(poVar2,"{\n");
    for (i_7 = 0; i_7 < 3; i_7 = i_7 + 1) {
      if (0 < i_7) {
        std::operator<<((ostream *)&i_6,"\n");
      }
      poVar2 = std::operator<<((ostream *)&i_6,"    gl_Position = gl_in[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_7);
      poVar2 = std::operator<<(poVar2,"].gl_Position;\n");
      poVar2 = std::operator<<(poVar2,"    out_color   = in_color[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_7);
      std::operator<<(poVar2,"];\n");
      if (((ulong)programCollection & 0x100000000) == 0) {
        for (local_938 = 0; local_938 < (int)caseDef_local.topology; local_938 = local_938 + 1) {
          poVar2 = std::operator<<((ostream *)&i_6,"    gl_ClipDistance[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_938);
          poVar2 = std::operator<<(poVar2,"] = gl_in[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_7);
          poVar2 = std::operator<<(poVar2,"].gl_ClipDistance[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_938);
          std::operator<<(poVar2,"];\n");
        }
        for (local_93c = 0; local_93c < (int)caseDef_local._4_4_; local_93c = local_93c + 1) {
          poVar2 = std::operator<<((ostream *)&i_6,"    gl_CullDistance[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_93c);
          poVar2 = std::operator<<(poVar2,"] = gl_in[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_7);
          poVar2 = std::operator<<(poVar2,"].gl_CullDistance[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_93c);
          std::operator<<(poVar2,"];\n");
        }
      }
      else {
        if (0 < (int)caseDef_local.topology) {
          poVar2 = std::operator<<((ostream *)&i_6,"    for (int i = 0; i < ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local.topology);
          poVar2 = std::operator<<(poVar2,"; ++i)\n");
          poVar2 = std::operator<<(poVar2,"        gl_ClipDistance[i] = gl_in[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_7);
          std::operator<<(poVar2,"].gl_ClipDistance[i];\n");
        }
        if (0 < (int)caseDef_local._4_4_) {
          poVar2 = std::operator<<((ostream *)&i_6,"    for (int i = 0; i < ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,caseDef_local._4_4_);
          poVar2 = std::operator<<(poVar2,"; ++i)\n");
          poVar2 = std::operator<<(poVar2,"        gl_CullDistance[i] = gl_in[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_7);
          std::operator<<(poVar2,"].gl_CullDistance[i];\n");
        }
      }
      std::operator<<((ostream *)&i_6,"    EmitVertex();\n");
    }
    std::operator<<((ostream *)&i_6,"}\n");
    uVar1 = perVertexBlock.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"geom",&local_961);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)uVar1,&local_960);
    std::__cxx11::ostringstream::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_990,&local_9b0);
    glu::ProgramSources::operator<<(pPVar4,&local_990);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_990);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::string::~string((string *)&local_960);
    std::allocator<char>::~allocator(&local_961);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i_6);
  }
  std::__cxx11::ostringstream::ostringstream(local_b28);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_b28,pcVar3);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in flat vec4 in_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 o_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    o_color = vec4(in_color.rgb + vec3(0.0, 0.0, 0.5), 1.0);\n");
  std::operator<<(poVar2,"}\n");
  uVar1 = perVertexBlock.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b48,"frag",&local_b49);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)uVar1,&local_b48);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_b78,&local_b98);
  glu::ProgramSources::operator<<(pPVar4,&local_b78);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator(&local_b49);
  std::__cxx11::ostringstream::~ostringstream(local_b28);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(caseDef.numClipDistances + caseDef.numCullDistances <= MAX_COMBINED_CLIP_AND_CULL_DISTANCES);

	std::string perVertexBlock;
	{
		std::ostringstream str;
		str << "gl_PerVertex {\n"
			<< "    vec4  gl_Position;\n";
		if (caseDef.numClipDistances > 0)
			str << "    float gl_ClipDistance[" << caseDef.numClipDistances << "];\n";
		if (caseDef.numCullDistances > 0)
			str << "    float gl_CullDistance[" << caseDef.numCullDistances << "];\n";
		str << "}";
		perVertexBlock = str.str();
	}

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 v_position;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = v_position;\n"
			<< "    out_color   = vec4(1.0, 0.5 * (v_position.x + 1.0), 0.0, 1.0);\n"
			<< "\n"
			<< "    const int barNdx = gl_VertexIndex / 6;\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_ClipDistance[i] = (barNdx == i ? v_position.y : 0.0);\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_CullDistance[i] = 0.0;\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_ClipDistance[" << i << "] = (barNdx == " << i << " ? v_position.y : 0.0);\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_CullDistance[" << i << "] = 0.0;\n";		// don't cull anything
		}
		src	<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	if (caseDef.enableTessellation)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(vertices = " << NUM_PATCH_CONTROL_POINTS << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color[];\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = 1.0;\n"
			<< "    gl_TessLevelInner[1] = 1.0;\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = 1.0;\n"
			<< "    gl_TessLevelOuter[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[2] = 1.0;\n"
			<< "    gl_TessLevelOuter[3] = 1.0;\n"
			<< "\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    out_color[gl_InvocationID]          = in_color[gl_InvocationID];\n"
			<< "\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_out[gl_InvocationID].gl_ClipDistance[i] = gl_in[gl_InvocationID].gl_ClipDistance[i];\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_out[gl_InvocationID].gl_CullDistance[i] = gl_in[gl_InvocationID].gl_CullDistance[i];\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_out[gl_InvocationID].gl_ClipDistance[" << i << "] = gl_in[gl_InvocationID].gl_ClipDistance[" << i << "];\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_out[gl_InvocationID].gl_CullDistance[" << i << "] = gl_in[gl_InvocationID].gl_CullDistance[" << i << "];\n";
		}
		src << "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	if (caseDef.enableTessellation)
	{
		DE_ASSERT(NUM_PATCH_CONTROL_POINTS == 3);  // assumed in shader code

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    vec3 px     = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 py     = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 pz     = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(px + py + pz, 1.0);\n"
			<< "    out_color   = (in_color[0] + in_color[1] + in_color[2]) / 3.0;\n"
			<< "\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_ClipDistance[i] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[i]\n"
					<< "                           + gl_TessCoord.y * gl_in[1].gl_ClipDistance[i]\n"
					<< "                           + gl_TessCoord.z * gl_in[2].gl_ClipDistance[i];\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_CullDistance[i] = gl_TessCoord.x * gl_in[0].gl_CullDistance[i]\n"
					<< "                           + gl_TessCoord.y * gl_in[1].gl_CullDistance[i]\n"
					<< "                           + gl_TessCoord.z * gl_in[2].gl_CullDistance[i];\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_ClipDistance[" << i << "] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.y * gl_in[1].gl_ClipDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.z * gl_in[2].gl_ClipDistance[" << i << "];\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_CullDistance[" << i << "] = gl_TessCoord.x * gl_in[0].gl_CullDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.y * gl_in[1].gl_CullDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.z * gl_in[2].gl_CullDistance[" << i << "];\n";
		}
		src << "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (caseDef.enableGeometry)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n";
		for (int vertNdx = 0; vertNdx < 3; ++vertNdx)
		{
			if (vertNdx > 0)
				src << "\n";
			src << "    gl_Position = gl_in[" << vertNdx << "].gl_Position;\n"
				<< "    out_color   = in_color[" << vertNdx << "];\n";
			if (caseDef.dynamicIndexing)
			{
				if (caseDef.numClipDistances > 0)
					src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
						<< "        gl_ClipDistance[i] = gl_in[" << vertNdx << "].gl_ClipDistance[i];\n";
				if (caseDef.numCullDistances > 0)
					src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
						<< "        gl_CullDistance[i] = gl_in[" << vertNdx << "].gl_CullDistance[i];\n";
			}
			else
			{
				for (int i = 0; i < caseDef.numClipDistances; ++i)
					src << "    gl_ClipDistance[" << i << "] = gl_in[" << vertNdx << "].gl_ClipDistance[" << i << "];\n";
				for (int i = 0; i < caseDef.numCullDistances; ++i)
					src << "    gl_CullDistance[" << i << "] = gl_in[" << vertNdx << "].gl_CullDistance[" << i << "];\n";
			}
			src << "    EmitVertex();\n";
		}
		src	<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in flat vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(in_color.rgb + vec3(0.0, 0.0, 0.5), 1.0);\n"  // mix with a constant color in case variable wasn't passed correctly through stages
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}